

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_global_motion_params
               (WarpedMotionParams *params,WarpedMotionParams *ref_params,aom_write_bit_buffer *wb,
               int allow_hp)

{
  byte bVar1;
  uint16_t k;
  int iVar2;
  int iVar3;
  sbyte sVar4;
  int in_ECX;
  aom_write_bit_buffer *in_RDX;
  int *in_RSI;
  long in_RDI;
  int trans_prec_diff;
  int trans_bits;
  TransformationType type;
  int16_t in_stack_ffffffffffffffc8;
  int16_t in_stack_ffffffffffffffca;
  uint16_t in_stack_ffffffffffffffcc;
  uint16_t in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar1 = *(byte *)(in_RDI + 0x20);
  aom_wb_write_bit(in_RDX,(uint)(bVar1 != 0));
  if ((bVar1 != 0) && (aom_wb_write_bit(in_RDX,(uint)(bVar1 == 2)), bVar1 != 2)) {
    aom_wb_write_bit(in_RDX,(uint)(bVar1 == 1));
  }
  if (1 < bVar1) {
    aom_wb_write_signed_primitive_refsubexpfin
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
               ,in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffca,
               in_stack_ffffffffffffffc8);
    aom_wb_write_signed_primitive_refsubexpfin
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
               ,in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffca,
               in_stack_ffffffffffffffc8);
  }
  if (2 < bVar1) {
    aom_wb_write_signed_primitive_refsubexpfin
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
               ,in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffca,
               in_stack_ffffffffffffffc8);
    aom_wb_write_signed_primitive_refsubexpfin
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
               ,in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffca,
               in_stack_ffffffffffffffc8);
  }
  if (bVar1 != 0) {
    if (bVar1 == 1) {
      iVar2 = 9 - (uint)((in_ECX != 0 ^ 0xffU) & 1);
      iVar3 = ((in_ECX != 0 ^ 0xffU) & 1) + 0xd;
    }
    else {
      iVar2 = 0xc;
      iVar3 = 10;
    }
    sVar4 = (sbyte)iVar3;
    k = (uint16_t)(*in_RSI >> sVar4);
    aom_wb_write_signed_primitive_refsubexpfin
              ((aom_write_bit_buffer *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffffce,k,
               in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8);
    aom_wb_write_signed_primitive_refsubexpfin
              ((aom_write_bit_buffer *)CONCAT44(iVar2,iVar3),(uint16_t)(in_RSI[1] >> sVar4),k,
               in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static inline void write_global_motion_params(
    const WarpedMotionParams *params, const WarpedMotionParams *ref_params,
    struct aom_write_bit_buffer *wb, int allow_hp) {
  const TransformationType type = params->wmtype;

  // As a workaround for an AV1 spec bug, we avoid choosing TRANSLATION
  // type models. Check here that we don't accidentally pick one somehow.
  // See comments in gm_get_motion_vector() for details on the bug we're
  // working around here
  assert(type != TRANSLATION);

  aom_wb_write_bit(wb, type != IDENTITY);
  if (type != IDENTITY) {
    aom_wb_write_bit(wb, type == ROTZOOM);
    if (type != ROTZOOM) aom_wb_write_bit(wb, type == TRANSLATION);
  }

  if (type >= ROTZOOM) {
    aom_wb_write_signed_primitive_refsubexpfin(
        wb, GM_ALPHA_MAX + 1, SUBEXPFIN_K,
        (ref_params->wmmat[2] >> GM_ALPHA_PREC_DIFF) -
            (1 << GM_ALPHA_PREC_BITS),
        (params->wmmat[2] >> GM_ALPHA_PREC_DIFF) - (1 << GM_ALPHA_PREC_BITS));
    aom_wb_write_signed_primitive_refsubexpfin(
        wb, GM_ALPHA_MAX + 1, SUBEXPFIN_K,
        (ref_params->wmmat[3] >> GM_ALPHA_PREC_DIFF),
        (params->wmmat[3] >> GM_ALPHA_PREC_DIFF));
  }

  if (type >= AFFINE) {
    aom_wb_write_signed_primitive_refsubexpfin(
        wb, GM_ALPHA_MAX + 1, SUBEXPFIN_K,
        (ref_params->wmmat[4] >> GM_ALPHA_PREC_DIFF),
        (params->wmmat[4] >> GM_ALPHA_PREC_DIFF));
    aom_wb_write_signed_primitive_refsubexpfin(
        wb, GM_ALPHA_MAX + 1, SUBEXPFIN_K,
        (ref_params->wmmat[5] >> GM_ALPHA_PREC_DIFF) -
            (1 << GM_ALPHA_PREC_BITS),
        (params->wmmat[5] >> GM_ALPHA_PREC_DIFF) - (1 << GM_ALPHA_PREC_BITS));
  }

  if (type >= TRANSLATION) {
    const int trans_bits = (type == TRANSLATION)
                               ? GM_ABS_TRANS_ONLY_BITS - !allow_hp
                               : GM_ABS_TRANS_BITS;
    const int trans_prec_diff = (type == TRANSLATION)
                                    ? GM_TRANS_ONLY_PREC_DIFF + !allow_hp
                                    : GM_TRANS_PREC_DIFF;
    aom_wb_write_signed_primitive_refsubexpfin(
        wb, (1 << trans_bits) + 1, SUBEXPFIN_K,
        (ref_params->wmmat[0] >> trans_prec_diff),
        (params->wmmat[0] >> trans_prec_diff));
    aom_wb_write_signed_primitive_refsubexpfin(
        wb, (1 << trans_bits) + 1, SUBEXPFIN_K,
        (ref_params->wmmat[1] >> trans_prec_diff),
        (params->wmmat[1] >> trans_prec_diff));
  }
}